

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

char * quicly_escape_unsafe_string(char *buf,void *bytes,size_t len)

{
  long in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  char *end;
  char *src;
  char *dst;
  uint8_t *local_28;
  uint8_t *local_20;
  
  local_20 = in_RDI;
  for (local_28 = in_RSI; local_28 != in_RSI + in_RDX; local_28 = local_28 + 1) {
    if (((((char)*local_28 < ' ') || ('~' < (char)*local_28)) || (*local_28 == '\"')) ||
       ((*local_28 == '\'' || (*local_28 == '\\')))) {
      *local_20 = '\\';
      local_20[1] = 'x';
      quicly_byte_to_hex((char *)(local_20 + 2),*local_28);
      local_20 = local_20 + 4;
    }
    else {
      *local_20 = *local_28;
      local_20 = local_20 + 1;
    }
  }
  *local_20 = '\0';
  return (char *)in_RDI;
}

Assistant:

char *quicly_escape_unsafe_string(char *buf, const void *bytes, size_t len)
{
    char *dst = buf;
    const char *src = bytes, *end = src + len;

    for (; src != end; ++src) {
        if ((0x20 <= *src && *src <= 0x7e) && !(*src == '"' || *src == '\'' || *src == '\\')) {
            *dst++ = *src;
        } else {
            *dst++ = '\\';
            *dst++ = 'x';
            quicly_byte_to_hex(dst, (uint8_t)*src);
            dst += 2;
        }
    }
    *dst = '\0';

    return buf;
}